

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GridRenderTestInstance *this)

{
  void **ppvVar1;
  VkAccessFlags *pVVar2;
  deUint32 numArrayLayers;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  undefined8 obj;
  Allocation *pAVar4;
  undefined8 renderPass;
  int iVar5;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  DeviceInterface *vk;
  VkDevice pVVar6;
  Allocator *allocator;
  TextureFormat format;
  const_iterator cVar7;
  GraphicsPipelineBuilder *pGVar8;
  TestLog *pTVar9;
  ConstPixelBufferAccess *__n;
  ConstPixelBufferAccess *pCVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  TestStatus *pTVar11;
  int iVar12;
  VkDeviceSize bufferSize;
  int iVar13;
  void *pvVar14;
  byte bVar15;
  int iVar16;
  VkImageSubresourceLayers subresourceLayers;
  VkExtent3D extent;
  IVec2 renderSize;
  string local_678;
  string local_658;
  VkDevice local_638;
  undefined1 local_630 [40];
  VkCommandBuffer local_608;
  long *plStack_600;
  VkAccessFlags local_5f8;
  VkAccessFlags VStack_5f4;
  VkImageLayout VStack_5f0;
  VkImageLayout VStack_5ec;
  Surface errorMask;
  LogImageSet local_5c8;
  deUint32 local_584;
  TestStatus *local_580;
  undefined1 local_578 [40];
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  ConstPixelBufferAccess imageAllLayers;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_4a0;
  VkQueue local_488;
  TextureFormat local_480;
  Vec4 clearColor;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  _Alloc_hider local_458;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448 [6];
  Image colorAttachmentImage;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_360;
  VkCommandPool local_348;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_340;
  VkPipelineLayout local_328;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_320;
  VkFramebuffer local_308;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_300;
  VkImageView local_2e8;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_2e0;
  Buffer colorBuffer;
  LogImage local_298;
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  ios_base local_190 [132];
  deUint32 local_10c;
  bool local_108;
  VkPrimitiveTopology local_104;
  VkImageCreateInfo colorImageCreateInfo;
  
  local_580 = __return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  colorAttachmentLayoutBarrier._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ppvVar1,
             "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
             ,0x86);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&colorAttachmentLayoutBarrier,
             (EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
  std::ios_base::~ios_base(local_190);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar6 = Context::getDevice((this->super_TestInstance).m_context);
  local_488 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_584 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  renderSize.m_data[0] = 0x100;
  renderSize.m_data[1] = 0x100;
  numArrayLayers = (this->m_params).numLayers;
  makeImageCreateInfo(&colorImageCreateInfo,&renderSize,VK_FORMAT_R8G8B8A8_UNORM,0x11,numArrayLayers
                     );
  iVar13 = (this->m_params).numLayers;
  local_638 = pVVar6;
  Image::Image(&colorAttachmentImage,vk,pVVar6,allocator,&colorImageCreateInfo,
               (MemoryRequirement)0x0);
  iVar12 = renderSize.m_data[1] * renderSize.m_data[0];
  iVar16 = (this->m_params).numLayers;
  format = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar5 = tcu::getPixelSize(format);
  bufferSize = (VkDeviceSize)(iVar12 * iVar16 * iVar5);
  makeBufferCreateInfo((VkBufferCreateInfo *)&colorAttachmentLayoutBarrier,bufferSize,2);
  pVVar6 = local_638;
  tessellation::Buffer::Buffer
            (&colorBuffer,vk,local_638,allocator,(VkBufferCreateInfo *)&colorAttachmentLayoutBarrier
             ,(MemoryRequirement)0x1);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = numArrayLayers;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&colorAttachmentLayoutBarrier,vk,pVVar6,
                (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                         m_data.object.m_internal,(uint)(iVar13 != 1) * 4 + VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  DStack_2e0.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_2e0.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_2e8.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_2e0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)&colorAttachmentLayoutBarrier,vk,pVVar6,
                 VK_FORMAT_R8G8B8A8_UNORM);
  renderPass = colorAttachmentLayoutBarrier._0_8_;
  DStack_4a0.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_4a0.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  DStack_4a0.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)&colorAttachmentLayoutBarrier,vk,pVVar6,
                  (VkRenderPass)colorAttachmentLayoutBarrier._0_8_,local_2e8,renderSize.m_data[0],
                  renderSize.m_data[1],(this->m_params).numLayers);
  DStack_300.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_300.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_308.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_300.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&colorAttachmentLayoutBarrier,vk,pVVar6);
  DStack_320.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_320.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_328.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_320.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&colorAttachmentLayoutBarrier,vk,pVVar6,
                  local_584);
  DStack_340.m_device = (VkDevice)colorAttachmentLayoutBarrier._16_8_;
  DStack_340.m_allocator = (VkAllocationCallbacks *)colorAttachmentLayoutBarrier._24_8_;
  local_348.m_internal = colorAttachmentLayoutBarrier._0_8_;
  DStack_340.m_deviceIface = (DeviceInterface *)colorAttachmentLayoutBarrier.pNext;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&colorAttachmentLayoutBarrier,vk,pVVar6,
             (VkCommandPool)colorAttachmentLayoutBarrier._0_8_,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_5f8 = colorAttachmentLayoutBarrier.srcAccessMask;
  VStack_5f4 = colorAttachmentLayoutBarrier.dstAccessMask;
  VStack_5f0 = colorAttachmentLayoutBarrier.oldLayout;
  VStack_5ec = colorAttachmentLayoutBarrier.newLayout;
  local_608 = (VkCommandBuffer)colorAttachmentLayoutBarrier._0_8_;
  plStack_600 = (long *)colorAttachmentLayoutBarrier.pNext;
  memset(&colorAttachmentLayoutBarrier,0,0xfc);
  local_10c = 1;
  local_108 = false;
  local_104 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  colorAttachmentLayoutBarrier.sType = renderSize.m_data[0];
  colorAttachmentLayoutBarrier._4_4_ = renderSize.m_data[1];
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_298.m_name._M_dataplus._M_p = (pointer)&local_298.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"vert","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,&local_298.m_name);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier,vk,pVVar6,
                      VK_SHADER_STAGE_VERTEX_BIT,*(ProgramBinary **)(cVar7._M_node + 2),
                      (VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_5c8.m_name._M_dataplus._M_p = (pointer)&local_5c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5c8,"frag","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,&local_5c8.m_name);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,pVVar6,VK_SHADER_STAGE_FRAGMENT_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_630._0_8_ = (long)local_630 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_630,"tesc","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)local_630);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,pVVar6,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  imageAllLayers.m_format = (TextureFormat)(imageAllLayers.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&imageAllLayers,"tese","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)&imageAllLayers);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,pVVar6,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  local_578._0_8_ = (long)local_578 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"geom","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)local_578);
  pGVar8 = GraphicsPipelineBuilder::setShader
                     (pGVar8,vk,pVVar6,VK_SHADER_STAGE_GEOMETRY_BIT,
                      *(ProgramBinary **)(cVar7._M_node + 2),(VkSpecializationInfo *)0x0);
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&clearColor,pGVar8,vk,pVVar6,local_328,
             (VkRenderPass)renderPass);
  obj = clearColor.m_data._0_8_;
  DStack_360.m_device = (VkDevice)local_468._M_allocated_capacity;
  DStack_360.m_allocator = (VkAllocationCallbacks *)local_468._8_8_;
  DStack_360.m_deviceIface = (DeviceInterface *)clearColor.m_data._8_8_;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 0.0;
  local_468._M_allocated_capacity = 0;
  local_468._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_578._0_8_ != (long)local_578 + 0x10) {
    operator_delete((void *)local_578._0_8_,local_578._16_8_ + 1);
  }
  if (imageAllLayers.m_format != (TextureFormat)(imageAllLayers.m_size.m_data + 2)) {
    operator_delete((void *)imageAllLayers.m_format,imageAllLayers._16_8_ + 1);
  }
  if (local_630._0_8_ != (long)local_630 + 0x10) {
    operator_delete((void *)local_630._0_8_,local_630._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8.m_name._M_dataplus._M_p != &local_5c8.m_name.field_2) {
    operator_delete(local_5c8.m_name._M_dataplus._M_p,
                    local_5c8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
    operator_delete(local_298.m_name._M_dataplus._M_p,
                    local_298.m_name.field_2._M_allocated_capacity + 1);
  }
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder
            ((GraphicsPipelineBuilder *)&colorAttachmentLayoutBarrier);
  beginCommandBuffer(vk,local_608);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = numArrayLayers;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_00);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_608,1,0x80,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  colorAttachmentLayoutBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentLayoutBarrier._4_4_ = 0;
  colorAttachmentLayoutBarrier.pNext = (void *)renderSize.m_data;
  clearColor.m_data[0] = 0.0;
  clearColor.m_data[1] = 0.0;
  clearColor.m_data[2] = 0.0;
  clearColor.m_data[3] = 1.0;
  beginRenderPass(vk,local_608,(VkRenderPass)renderPass,local_308,
                  (VkRect2D *)&colorAttachmentLayoutBarrier,&clearColor);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_608,0,obj);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_608,1,1,0,0);
  endRenderPass(vk,local_608);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = numArrayLayers;
  makeImageMemoryBarrier
            (&colorAttachmentLayoutBarrier,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
             (VkImage)colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                      m_data.object.m_internal,subresourceRange_01);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_608,0x400,0x1000,0,0,0,0,0,1,(int)&colorAttachmentLayoutBarrier);
  subresourceLayers._8_8_ = (ulong)(uint)(this->m_params).numLayers << 0x20;
  subresourceLayers.aspectMask = 1;
  subresourceLayers.mipLevel = 0;
  extent.depth = 1;
  extent.width = renderSize.m_data[0];
  extent.height = renderSize.m_data[1];
  makeBufferImageCopy((VkBufferImageCopy *)&colorAttachmentLayoutBarrier,extent,subresourceLayers);
  (*vk->_vptr_DeviceInterface[99])
            (vk,local_608,
             colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
             object.m_internal,6,
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,1,(int)&colorAttachmentLayoutBarrier);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)&colorAttachmentLayoutBarrier,0x1000,0x2000,
             (VkBuffer)
             colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_608,0x1000,0x4000,0,0,0,1,&colorAttachmentLayoutBarrier,0,0);
  endCommandBuffer(vk,local_608);
  submitCommandsAndWait(vk,pVVar6,local_488,local_608);
  pAVar4 = colorBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,pVVar6,
             (VkDeviceMemory)
             ((colorBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (colorBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  colorAttachmentLayoutBarrier._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&imageAllLayers,(TextureFormat *)&colorAttachmentLayoutBarrier,renderSize.m_data[0],
             renderSize.m_data[1],(this->m_params).numLayers,pAVar4->m_hostPtr);
  if ((this->m_params).numLayers < 1) {
    bVar15 = 1;
  }
  else {
    bVar15 = 1;
    iVar13 = 0;
    do {
      if (bVar15 == 0) {
        bVar15 = 0;
      }
      else {
        pTVar9 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        local_638 = (VkDevice)CONCAT44(local_638._4_4_,iVar13);
        tcu::getSubregion((ConstPixelBufferAccess *)local_578,&imageAllLayers,0,0,iVar13,
                          renderSize.m_data[0],renderSize.m_data[1],1);
        tcu::Surface::Surface(&errorMask,local_578._8_4_,local_578._12_4_);
        clearColor.m_data[0] = 1.12104e-44;
        clearColor.m_data[1] = 4.2039e-45;
        ppvVar1 = &colorAttachmentLayoutBarrier.pNext;
        pvVar14 = (void *)errorMask.m_pixels.m_cap;
        if (errorMask.m_pixels.m_cap != 0) {
          pvVar14 = errorMask.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)&colorAttachmentLayoutBarrier,(TextureFormat *)&clearColor,
                   errorMask.m_width,errorMask.m_height,1,pvVar14);
        clearColor.m_data[0] = 0.0;
        clearColor.m_data[1] = 1.0;
        clearColor.m_data[2] = 0.0;
        clearColor.m_data[3] = 1.0;
        tcu::clear((PixelBufferAccess *)&colorAttachmentLayoutBarrier,&clearColor);
        colorAttachmentLayoutBarrier._0_8_ = pTVar9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppvVar1,"Verifying output layer ",0x17);
        std::ostream::operator<<(ppvVar1,(int)local_638);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                   (EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar1);
        std::ios_base::~ios_base(local_190);
        iVar16 = 0;
        iVar13 = iVar16;
        if (0 < (int)local_578._12_4_) {
          iVar13 = 0;
          do {
            if (0 < (int)local_578._8_4_) {
              iVar5 = 0;
              do {
                tcu::ConstPixelBufferAccess::getPixel
                          ((ConstPixelBufferAccess *)&colorAttachmentLayoutBarrier,
                           (int)(ConstPixelBufferAccess *)local_578,iVar5,iVar16);
                tcu::RGBA::RGBA((RGBA *)&clearColor,(Vec4 *)&colorAttachmentLayoutBarrier);
                if (((uint)clearColor.m_data[0] & 0xff00) < 0xf700 ||
                    0x80000 < ((uint)clearColor.m_data[0] & 0xff0000)) {
                  *(undefined4 *)
                   ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * iVar16 + iVar5) * 4)
                       = 0xff0000ff;
                  iVar13 = 1;
                }
                iVar5 = iVar5 + 1;
              } while (iVar5 < (int)local_578._8_4_);
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < (int)local_578._12_4_);
        }
        if (iVar13 == 0) {
          colorAttachmentLayoutBarrier._0_8_ = pTVar9;
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&colorAttachmentLayoutBarrier.pNext,"Image valid.",0xc);
          pTVar9 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          local_5c8.m_name._M_dataplus._M_p = (pointer)&local_5c8.m_name.field_2;
          clearColor.m_data[0] = 2.38221e-44;
          clearColor.m_data[1] = 0.0;
          local_5c8.m_name._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_5c8,(ulong)&clearColor);
          local_5c8.m_name.field_2._M_allocated_capacity._0_4_ = clearColor.m_data[0];
          local_5c8.m_name.field_2._M_allocated_capacity._4_4_ = clearColor.m_data[1];
          *(undefined8 *)local_5c8.m_name._M_dataplus._M_p = 0x7265566567616d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 8) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 9) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 10) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 0xb) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 0xc) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 0xe) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c8.m_name._M_dataplus._M_p + 0xf) = 'o';
          local_5c8.m_name._M_dataplus._M_p[0x10] = 'n';
          local_5c8.m_name._M_string_length._0_4_ = clearColor.m_data[0];
          local_5c8.m_name._M_string_length._4_4_ = clearColor.m_data[1];
          local_5c8.m_name._M_dataplus._M_p[clearColor.m_data._0_8_] = '\0';
          local_630._0_8_ = (long)local_630 + 0x10;
          clearColor.m_data[0] = 2.52234e-44;
          clearColor.m_data[1] = 0.0;
          local_630._0_8_ = std::__cxx11::string::_M_create((ulong *)local_630,(ulong)&clearColor);
          local_630._16_4_ = clearColor.m_data[0];
          local_630._20_4_ = clearColor.m_data[1];
          *(undefined8 *)local_630._0_8_ = 0x6576206567616d49;
          builtin_strncpy((char *)(local_630._0_8_ + 8),"rificati",8);
          ((char *)(local_630._0_8_ + 0x10))[0] = 'o';
          ((char *)(local_630._0_8_ + 0x10))[1] = 'n';
          local_630._8_4_ = clearColor.m_data[0];
          local_630._12_4_ = clearColor.m_data[1];
          *(char *)(local_630._0_8_ + clearColor.m_data._0_8_) = '\0';
          tcu::LogImageSet::LogImageSet
                    ((LogImageSet *)&local_298,&local_5c8.m_name,(string *)local_630);
          tcu::TestLog::startImageSet
                    (pTVar9,local_298.m_name._M_dataplus._M_p,
                     local_298.m_description._M_dataplus._M_p);
          local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
          local_678._M_string_length = 6;
          local_678.field_2._M_allocated_capacity._0_7_ = 0x746c75736552;
          local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
          local_658.field_2._8_7_ = 0x746c7573657220;
          local_658.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
          local_658.field_2._M_local_buf[7] = 'd';
          local_658._M_string_length = 0xf;
          local_658.field_2._M_local_buf[0xf] = '\0';
          pCVar10 = (ConstPixelBufferAccess *)local_578;
          tcu::LogImage::LogImage
                    ((LogImage *)&clearColor,&local_678,&local_658,
                     (ConstPixelBufferAccess *)local_578,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&clearColor,(int)pTVar9,__buf_01,(size_t)pCVar10);
          tcu::TestLog::endImageSet(pTVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_p != local_448) {
            operator_delete(local_458._M_p,local_448[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)clearColor.m_data._0_8_ != &local_468) {
            operator_delete((void *)clearColor.m_data._0_8_,
                            (ulong)(local_468._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,
                            CONCAT17(local_658.field_2._M_local_buf[7],
                                     local_658.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != &local_678.field_2) {
            operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
            operator_delete(local_298.m_description._M_dataplus._M_p,
                            local_298.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
            operator_delete(local_298.m_name._M_dataplus._M_p,
                            local_298.m_name.field_2._M_allocated_capacity + 1);
          }
          if (local_630._0_8_ != (long)local_630 + 0x10) {
            operator_delete((void *)local_630._0_8_,local_630._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8.m_name._M_dataplus._M_p != &local_5c8.m_name.field_2) {
            operator_delete(local_5c8.m_name._M_dataplus._M_p,
                            local_5c8.m_name.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          colorAttachmentLayoutBarrier._0_8_ = pTVar9;
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&colorAttachmentLayoutBarrier.pNext,
                     "Image verification failed, found invalid pixels.",0x30);
          pTVar9 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)&colorAttachmentLayoutBarrier,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
          local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
          clearColor.m_data[0] = 2.38221e-44;
          clearColor.m_data[1] = 0.0;
          local_678._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&clearColor);
          local_678.field_2._M_allocated_capacity._0_4_ = clearColor.m_data[0];
          local_678.field_2._M_allocated_capacity._4_4_ = clearColor.m_data[1];
          *(undefined8 *)local_678._M_dataplus._M_p = 0x7265566567616d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 8) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 9) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 10) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 0xb) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 0xc) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 0xd) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 0xe) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_678._M_dataplus._M_p + 0xf) = 'o';
          local_678._M_dataplus._M_p[0x10] = 'n';
          local_678._M_string_length._0_4_ = clearColor.m_data[0];
          local_678._M_string_length._4_4_ = clearColor.m_data[1];
          local_678._M_dataplus._M_p[clearColor.m_data._0_8_] = '\0';
          local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
          clearColor.m_data[0] = 2.52234e-44;
          clearColor.m_data[1] = 0.0;
          local_658._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_658,(ulong)&clearColor);
          local_658.field_2._M_allocated_capacity._0_7_ = clearColor.m_data._0_7_;
          local_658.field_2._M_local_buf[7] = clearColor.m_data[1]._3_1_;
          *(undefined8 *)local_658._M_dataplus._M_p = 0x6576206567616d49;
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 8) = 'r';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 9) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 10) = 'f';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0xb) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0xc) = 'c';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0xd) = 'a';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0xe) = 't';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0xf) = 'i';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0x10) = 'o';
          *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_658._M_dataplus._M_p + 0x11) = 'n';
          local_658._M_string_length._0_4_ = clearColor.m_data[0];
          local_658._M_string_length._4_4_ = clearColor.m_data[1];
          local_658._M_dataplus._M_p[clearColor.m_data._0_8_] = '\0';
          tcu::LogImageSet::LogImageSet(&local_5c8,&local_678,&local_658);
          tcu::TestLog::startImageSet
                    (pTVar9,local_5c8.m_name._M_dataplus._M_p,
                     local_5c8.m_description._M_dataplus._M_p);
          pCVar10 = (ConstPixelBufferAccess *)local_630;
          local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
          local_4f0.field_2._M_allocated_capacity._4_2_ = 0x746c;
          local_4f0.field_2._M_allocated_capacity._0_4_ = 0x75736552;
          local_4f0._M_string_length = 6;
          local_4f0.field_2._M_local_buf[6] = '\0';
          local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
          local_510.field_2._8_7_ = 0x746c7573657220;
          local_510.field_2._M_allocated_capacity._0_7_ = 0x657265646e6552;
          local_510.field_2._M_local_buf[7] = 'd';
          local_510._M_string_length = 0xf;
          local_510.field_2._M_local_buf[0xf] = '\0';
          __n = (ConstPixelBufferAccess *)local_578;
          tcu::LogImage::LogImage
                    ((LogImage *)&clearColor,&local_4f0,&local_510,
                     (ConstPixelBufferAccess *)local_578,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write((LogImage *)&clearColor,(int)pTVar9,__buf,(size_t)__n);
          local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
          local_530.field_2._M_allocated_capacity = 0x73614d726f727245;
          local_530.field_2._M_local_buf[8] = 'k';
          local_530._M_string_length = 9;
          local_530.field_2._M_local_buf[9] = '\0';
          local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
          local_550.field_2._M_allocated_capacity = 0x616d20726f727245;
          local_550.field_2._8_2_ = 0x6b73;
          local_550._M_string_length = 10;
          local_550.field_2._M_local_buf[10] = '\0';
          local_480.order = RGBA;
          local_480.type = UNORM_INT8;
          pvVar14 = (void *)errorMask.m_pixels.m_cap;
          if (errorMask.m_pixels.m_cap != 0) {
            pvVar14 = errorMask.m_pixels.m_ptr;
          }
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)pCVar10,&local_480,errorMask.m_width,errorMask.m_height,1,
                     pvVar14);
          tcu::LogImage::LogImage
                    (&local_298,&local_530,&local_550,pCVar10,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_298,(int)pTVar9,__buf_00,(size_t)pCVar10);
          tcu::TestLog::endImageSet(pTVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_description._M_dataplus._M_p != &local_298.m_description.field_2) {
            operator_delete(local_298.m_description._M_dataplus._M_p,
                            local_298.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
            operator_delete(local_298.m_name._M_dataplus._M_p,
                            local_298.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_550._M_dataplus._M_p != &local_550.field_2) {
            operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_530._M_dataplus._M_p != &local_530.field_2) {
            operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_458._M_p != local_448) {
            operator_delete(local_458._M_p,local_448[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)clearColor.m_data._0_8_ != &local_468) {
            operator_delete((void *)clearColor.m_data._0_8_,
                            (ulong)(local_468._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_510._M_dataplus._M_p != &local_510.field_2) {
            operator_delete(local_510._M_dataplus._M_p,
                            CONCAT17(local_510.field_2._M_local_buf[7],
                                     local_510.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
            operator_delete(local_4f0._M_dataplus._M_p,
                            CONCAT17(local_4f0.field_2._M_local_buf[7],
                                     CONCAT16(local_4f0.field_2._M_local_buf[6],
                                              CONCAT24(local_4f0.field_2._M_allocated_capacity._4_2_
                                                       ,local_4f0.field_2._M_allocated_capacity.
                                                        _0_4_))) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8.m_description._M_dataplus._M_p != &local_5c8.m_description.field_2) {
            operator_delete(local_5c8.m_description._M_dataplus._M_p,
                            local_5c8.m_description.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_5c8.m_name._M_dataplus._M_p != &local_5c8.m_name.field_2) {
            operator_delete(local_5c8.m_name._M_dataplus._M_p,
                            local_5c8.m_name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_658._M_dataplus._M_p != &local_658.field_2) {
            operator_delete(local_658._M_dataplus._M_p,
                            CONCAT17(local_658.field_2._M_local_buf[7],
                                     local_658.field_2._M_allocated_capacity._0_7_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_678._M_dataplus._M_p != &local_678.field_2) {
            operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream
                  ((ostringstream *)&colorAttachmentLayoutBarrier.pNext);
        std::ios_base::~ios_base(local_190);
        bVar15 = (byte)iVar13 ^ 1;
        tcu::Surface::~Surface(&errorMask);
        iVar13 = (int)local_638;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < (this->m_params).numLayers);
  }
  pVVar2 = &colorAttachmentLayoutBarrier.srcAccessMask;
  colorAttachmentLayoutBarrier._0_8_ = pVVar2;
  if (bVar15 == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&colorAttachmentLayoutBarrier,"Image comparison failed","");
    pTVar11 = local_580;
    local_580->m_code = QP_TEST_RESULT_FAIL;
    (local_580->m_description)._M_dataplus._M_p = (pointer)&(local_580->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_580->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&colorAttachmentLayoutBarrier,"OK","")
    ;
    pTVar11 = local_580;
    local_580->m_code = QP_TEST_RESULT_PASS;
    (local_580->m_description)._M_dataplus._M_p = (pointer)&(local_580->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_580->m_description,colorAttachmentLayoutBarrier._0_8_,
               (long)colorAttachmentLayoutBarrier.pNext + colorAttachmentLayoutBarrier._0_8_);
  }
  if ((VkAccessFlags *)colorAttachmentLayoutBarrier._0_8_ != pVVar2) {
    operator_delete((void *)colorAttachmentLayoutBarrier._0_8_,
                    colorAttachmentLayoutBarrier._16_8_ + 1);
  }
  if (obj != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_360,(VkPipeline)obj);
  }
  if (local_608 != (VkCommandBuffer)0x0) {
    clearColor.m_data._0_8_ = local_608;
    (**(code **)(*plStack_600 + 0x240))(plStack_600,_local_5f8,_VStack_5f0,1);
  }
  if (local_348.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_340,local_348);
  }
  if (local_328.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_320,local_328);
  }
  if (local_308.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_300,local_308);
  }
  if (renderPass != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_4a0,(VkRenderPass)renderPass);
  }
  if (local_2e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_2e0,local_2e8);
  }
  if (colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
      .m_data.ptr != (Allocation *)0x0) {
    (*(colorBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
      0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               colorBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  if (colorAttachmentImage.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(colorAttachmentImage.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    colorAttachmentImage.m_allocation.
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)0x0;
  }
  if (colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
      m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&colorAttachmentImage.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                deleter,(VkImage)colorAttachmentImage.m_image.
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal);
  }
  return pTVar11;
}

Assistant:

tcu::TestStatus GridRenderTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
		<< tcu::TestLog::EndMessage;

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize			   = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat			   = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageAllLayersRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_params.numLayers);
	const VkImageCreateInfo		  colorImageCreateInfo	   = makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, m_params.numLayers);
	const VkImageViewType		  colorAttachmentViewType  = (m_params.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
	const Image					  colorAttachmentImage	   (vk, device, allocator, colorImageCreateInfo, MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification (big enough for all layers).

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * m_params.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline: no vertex input attributes nor descriptors.

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, colorAttachmentViewType, colorFormat, colorImageAllLayersRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), m_params.numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline (GraphicsPipelineBuilder()
		.setRenderSize	(renderSize)
		.setShader		(vk, device, VK_SHADER_STAGE_VERTEX_BIT,				  m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				  m_context.getBinaryCollection().get("frag"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	  m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				  m_context.getBinaryCollection().get("geom"), DE_NULL)
		.build			(vk, device, *pipelineLayout, *renderPass));

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkImageSubresourceLayers subresourceLayers = makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, m_params.numLayers);
		const VkBufferImageCopy		   copyRegion		 = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), subresourceLayers);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imageAllLayers(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), m_params.numLayers, alloc.getHostPtr());

		bool allOk = true;
		for (int ndx = 0; ndx < m_params.numLayers; ++ndx)
			allOk = allOk && verifyResultLayer(m_context.getTestContext().getLog(),
											   tcu::getSubregion(imageAllLayers, 0, 0, ndx, renderSize.x(), renderSize.y(), 1),
											   ndx);

		return (allOk ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
	}
}